

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool soul::AST::isResolvedAsConstant(Expression *e)

{
  bool bVar1;
  bool local_22;
  pool_ptr<soul::AST::Constant> local_20;
  Expression *local_18;
  Expression *e_local;
  
  local_18 = e;
  bVar1 = isResolvedAsValue(e);
  local_22 = false;
  if (bVar1) {
    (*(local_18->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_20);
    local_22 = pool_ptr<soul::AST::Constant>::operator!=(&local_20,(void *)0x0);
  }
  e_local._7_1_ = local_22;
  if (bVar1) {
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_20);
  }
  return (bool)(e_local._7_1_ & 1);
}

Assistant:

static bool isResolvedAsConstant (Expression& e)             { return isResolvedAsValue (e) && e.getAsConstant() != nullptr; }